

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(QPDFAcroFormDocumentHelper *this,QPDF *qpdf)

{
  Members *this_00;
  QPDF *qpdf_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  QPDFDocumentHelper::QPDFDocumentHelper(&this->super_QPDFDocumentHelper,qpdf);
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFAcroFormDocumentHelper_0058be70;
  this_00 = (Members *)operator_new(200);
  Members::Members(this_00);
  std::shared_ptr<QPDFAcroFormDocumentHelper::Members>::
  shared_ptr<QPDFAcroFormDocumentHelper::Members,void>(&this->m,this_00);
  analyze(this);
  return;
}

Assistant:

QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    // We have to analyze up front. Otherwise, when we are adding annotations and fields, we are in
    // a temporarily unstable configuration where some widget annotations are not reachable.
    analyze();
}